

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-open.c
# Opt level: O0

void seek_buffer(hd_context *ctx,hd_stream *stm,int64_t offset,int whence)

{
  long lVar1;
  int64_t pos;
  int64_t iStack_20;
  int whence_local;
  int64_t offset_local;
  hd_stream *stm_local;
  hd_context *ctx_local;
  
  lVar1 = (long)stm->pos - ((long)stm->wp - (long)stm->rp);
  if (whence == 1) {
    iStack_20 = lVar1 + offset;
  }
  else {
    iStack_20 = offset;
    if (whence == 2) {
      iStack_20 = stm->pos + offset;
    }
  }
  if (iStack_20 < 0) {
    iStack_20 = 0;
  }
  if (stm->pos < iStack_20) {
    iStack_20 = (int64_t)stm->pos;
  }
  stm->rp = stm->rp + ((int)iStack_20 - (int)lVar1);
  return;
}

Assistant:

static void seek_buffer(hd_context *ctx, hd_stream *stm, int64_t offset, int whence)
{
    int64_t pos = stm->pos - (stm->wp - stm->rp);
    /* Convert to absolute pos */
    if (whence == 1)
    {
        offset += pos; /* Was relative to current pos */
    }
    else if (whence == 2)
    {
        offset += stm->pos; /* Was relative to end */
    }

    if (offset < 0)
        offset = 0;
    if (offset > stm->pos)
        offset = stm->pos;
    stm->rp += (int)(offset - pos);
}